

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v8::detail::write_ptr<char,fmt::v8::appender,unsigned_long>
                   (appender out,unsigned_long value,basic_format_specs<char> *specs)

{
  ulong uVar1;
  size_t sVar2;
  size_t size;
  long lVar3;
  char *pcVar4;
  long lVar5;
  buffer<char> *buf;
  unsigned_long uVar6;
  bool bVar7;
  anon_class_16_2_92d121e5 write;
  anon_class_16_2_92d121e5 local_38;
  char local_28 [32];
  
  size = 2;
  uVar6 = value;
  do {
    sVar2 = size;
    size = sVar2 + 1;
    bVar7 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar7);
  local_38.num_digits = (int)sVar2 + -1;
  local_38.value = value;
  if (specs == (basic_format_specs<char> *)0x0) {
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8)
     + lVar3) = 0x30;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) <
        *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container)
                (out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container);
    }
    lVar3 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 0x10)
         = lVar3 + 1;
    *(undefined1 *)
     (*(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container + 8)
     + lVar3) = 0x78;
    lVar3 = (long)local_38.num_digits;
    if (lVar3 < 0) {
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/core.h"
                  ,0x182,"negative value");
    }
    lVar5 = *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container
                     + 0x10);
    uVar1 = lVar5 + lVar3;
    if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                  0x18) < uVar1) {
      lVar5 = 0;
    }
    else {
      *(ulong *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container +
                0x10) = uVar1;
      lVar5 = lVar5 + *(long *)((long)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>
                                      .container + 8);
    }
    if (lVar5 == 0) {
      pcVar4 = local_28 + lVar3 + -1;
      uVar6 = local_38.value;
      do {
        *pcVar4 = "0123456789abcdef"[(uint)uVar6 & 0xf];
        pcVar4 = pcVar4 + -1;
        bVar7 = 0xf < uVar6;
        uVar6 = uVar6 >> 4;
      } while (bVar7);
      out = copy_str_noinline<char,char*,fmt::v8::appender>(local_28,local_28 + lVar3,out);
    }
    else {
      pcVar4 = (char *)(lVar3 + lVar5);
      do {
        pcVar4 = pcVar4 + -1;
        *pcVar4 = "0123456789abcdef"[(uint)local_38.value & 0xf];
        bVar7 = 0xf < local_38.value;
        local_38.value = local_38.value >> 4;
      } while (bVar7);
    }
  }
  else {
    out = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_ptr<char,fmt::v8::appender,unsigned_long>(fmt::v8::appender,unsigned_long,fmt::v8::basic_format_specs<char>const*)::_lambda(fmt::v8::appender)_1_&>
                    (out,specs,size,size,&local_38);
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

auto write_ptr(OutputIt out, UIntPtr value,
               const basic_format_specs<Char>* specs) -> OutputIt {
  int num_digits = count_digits<4>(value);
  auto size = to_unsigned(num_digits) + size_t(2);
  auto write = [=](reserve_iterator<OutputIt> it) {
    *it++ = static_cast<Char>('0');
    *it++ = static_cast<Char>('x');
    return format_uint<4, Char>(it, value, num_digits);
  };
  return specs ? write_padded<align::right>(out, *specs, size, write)
               : base_iterator(out, write(reserve(out, size)));
}